

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack-utils.cpp
# Opt level: O0

void __thiscall wasm::StackSignature::StackSignature(StackSignature *this,Expression *expr)

{
  bool bVar1;
  Expression **ppEVar2;
  Iterator IVar3;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  Type local_120;
  BasicType local_114;
  Type local_110;
  Type *local_108;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_100;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_f0;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> local_e0;
  const_iterator local_d8;
  Expression *local_d0;
  Expression *child;
  Index local_c0;
  undefined1 local_b8 [8];
  Iterator __end1;
  undefined1 local_98 [8];
  Iterator __begin1;
  AbstractChildIterator<wasm::ValueChildIterator> local_78;
  AbstractChildIterator<wasm::ValueChildIterator> *local_38;
  ValueChildIterator *__range1;
  vector<wasm::Type,_std::allocator<wasm::Type>_> inputs;
  Expression *expr_local;
  StackSignature *this_local;
  
  inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)expr;
  wasm::Type::Type(&this->params);
  wasm::Type::Type(&this->results);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range1);
  ValueChildIterator::ValueChildIterator
            ((ValueChildIterator *)&local_78,
             (Expression *)
             inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  local_38 = &local_78;
  IVar3 = AbstractChildIterator<wasm::ValueChildIterator>::begin(local_38);
  __end1._8_8_ = IVar3.parent;
  __begin1.parent._0_4_ = IVar3.index;
  local_98 = (undefined1  [8])__end1._8_8_;
  IVar3 = AbstractChildIterator<wasm::ValueChildIterator>::end(local_38);
  child = (Expression *)IVar3.parent;
  local_c0 = IVar3.index;
  local_b8 = (undefined1  [8])child;
  __end1.parent._0_4_ = local_c0;
  while( true ) {
    bVar1 = AbstractChildIterator<wasm::ValueChildIterator>::Iterator::operator!=
                      ((Iterator *)local_98,(Iterator *)local_b8);
    if (!bVar1) {
      ValueChildIterator::~ValueChildIterator((ValueChildIterator *)&local_78);
      wasm::Type::Type(&local_110,(Tuple *)&__range1);
      (this->params).id = local_110.id;
      local_114 = unreachable;
      bVar1 = wasm::Type::operator==
                        (inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1,&local_114);
      if (bVar1) {
        this->kind = Polymorphic;
        wasm::Type::Type(&local_120,none);
        (this->results).id = local_120.id;
      }
      else {
        this->kind = Fixed;
        (this->results).id =
             inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage[1].id;
      }
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range1);
      return;
    }
    ppEVar2 = AbstractChildIterator<wasm::ValueChildIterator>::Iterator::operator*
                        ((Iterator *)local_98);
    local_d0 = *ppEVar2;
    bVar1 = wasm::Type::isConcrete(&local_d0->type);
    if (!bVar1) break;
    local_e0._M_current =
         (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end
                           ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range1);
    __gnu_cxx::
    __normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>::
    __normal_iterator<wasm::Type*>
              ((__normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>
                *)&local_d8,&local_e0);
    PVar4 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            wasm::Type::begin(&local_d0->type);
    local_f0 = PVar4;
    PVar4 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            wasm::Type::end(&local_d0->type);
    local_100 = PVar4;
    local_108 = (Type *)std::vector<wasm::Type,std::allocator<wasm::Type>>::
                        insert<wasm::Type::Iterator,void>
                                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)&__range1,
                                   local_d8,(Iterator)local_f0,(Iterator)PVar4);
    AbstractChildIterator<wasm::ValueChildIterator>::Iterator::operator++((Iterator *)local_98);
  }
  __assert_fail("child->type.isConcrete()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/stack-utils.cpp"
                ,0x3e,"wasm::StackSignature::StackSignature(Expression *)");
}

Assistant:

StackSignature::StackSignature(Expression* expr) {
  std::vector<Type> inputs;
  for (auto* child : ValueChildIterator(expr)) {
    assert(child->type.isConcrete());
    // Children might be tuple pops, so expand their types
    inputs.insert(inputs.end(), child->type.begin(), child->type.end());
  }
  params = Type(inputs);
  if (expr->type == Type::unreachable) {
    kind = Polymorphic;
    results = Type::none;
  } else {
    kind = Fixed;
    results = expr->type;
  }
}